

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

LO Omega_h::find_last<signed_char>(Read<signed_char> *array,char value)

{
  Alloc *pAVar1;
  int iVar2;
  undefined4 uVar3;
  type transform;
  
  pAVar1 = (array->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = (undefined4)pAVar1->size;
  }
  else {
    uVar3 = (undefined4)((ulong)pAVar1 >> 3);
  }
  Write<signed_char>::Write((Write<signed_char> *)&transform,&array->write_);
  transform.value = value;
  iVar2 = transform_reduce<Omega_h::IntIterator,Omega_h::find_last<signed_char>(Omega_h::Read<signed_char>,signed_char)::_lambda(int)_1_,int,Omega_h::maximum<int>>
                    (0,uVar3,0xffffffffffffffff,&transform);
  Write<signed_char>::~Write((Write<signed_char> *)&transform);
  return iVar2;
}

Assistant:

LO find_last(Read<T> array, T value) {
  auto const first = IntIterator(0);
  auto const last = IntIterator(array.size());
  auto const init = -1;
  auto const op = maximum<LO>();
  auto transform = OMEGA_H_LAMBDA(LO i)->LO {
    if (array[i] == value)
      return i;
    else
      return -1;
  };
  return transform_reduce(first, last, init, op, std::move(transform));
}